

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(parent_node_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  int extraout_EAX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  int iVar1;
  undefined4 in_register_00000034;
  result_options in_stack_00000008;
  
  current = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            (ulong)(uint)this->ancestor_depth_;
  for (iVar1 = 0;
      ((basic_path_node<char> *)__writefds != (basic_path_node<char> *)0x0 &&
      (iVar1 < this->ancestor_depth_)); iVar1 = iVar1 + 1) {
    __writefds = (fd_set *)((basic_path_node<char> *)__writefds)->parent_;
  }
  if ((basic_path_node<char> *)__writefds != (basic_path_node<char> *)0x0) {
    current = select<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __readfds,(basic_path_node<char> *)__writefds);
    if (current != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
      base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select(&this->
                     super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ,(eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                      *)CONCAT44(in_register_00000034,__nfds),(reference)__readfds,
                    (path_node_type *)__writefds,current,(node_receiver_type *)__timeout,
                    in_stack_00000008);
      return extraout_EAX;
    }
  }
  return (int)current;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root,*ancestor);
                if (ptr != nullptr)
                {
                    this->tail_select(context, root, *ancestor, *ptr, receiver, options);
                }
            }
        }